

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PulseQueuedTape.cpp
# Opt level: O0

Pulse __thiscall Storage::Tape::PulseQueuedTape::virtual_get_next_pulse(PulseQueuedTape *this)

{
  size_type sVar1;
  size_type sVar2;
  reference pvVar3;
  Pulse PVar4;
  size_t read_pointer;
  uint local_38;
  size_t local_30;
  uint local_28;
  PulseQueuedTape *this_local;
  undefined4 uStack_10;
  uint local_c;
  
  if ((this->is_at_end_ & 1U) == 0) {
    sVar1 = this->pulse_pointer_;
    sVar2 = std::vector<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>::
            size(&this->queued_pulses_);
    if (sVar1 == sVar2) {
      clear(this);
      (*(this->super_Tape)._vptr_Tape[9])();
      if (((this->is_at_end_ & 1U) != 0) ||
         (sVar1 = this->pulse_pointer_,
         sVar2 = std::
                 vector<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>::
                 size(&this->queued_pulses_), sVar1 == sVar2)) {
        PVar4 = silence(this);
        read_pointer = PVar4._0_8_;
        stack0xffffffffffffffec = read_pointer;
        local_38 = PVar4.length.clock_rate;
        local_c = local_38;
        goto LAB_009c0090;
      }
    }
    sVar1 = this->pulse_pointer_;
    this->pulse_pointer_ = this->pulse_pointer_ + 1;
    pvVar3 = std::vector<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>::
             operator[](&this->queued_pulses_,sVar1);
    this_local._4_4_ = pvVar3->type;
    uStack_10 = (pvVar3->length).length;
    local_c = (pvVar3->length).clock_rate;
  }
  else {
    PVar4 = silence(this);
    local_30 = PVar4._0_8_;
    stack0xffffffffffffffec = local_30;
    local_28 = PVar4.length.clock_rate;
    local_c = local_28;
  }
LAB_009c0090:
  PVar4.length.clock_rate = local_c;
  PVar4.type = this_local._4_4_;
  PVar4.length.length = uStack_10;
  return PVar4;
}

Assistant:

Tape::Pulse PulseQueuedTape::virtual_get_next_pulse() {
	if(is_at_end_) {
		return silence();
	}

	if(pulse_pointer_ == queued_pulses_.size()) {
		clear();
		get_next_pulses();

		if(is_at_end_ || pulse_pointer_ == queued_pulses_.size()) {
			return silence();
		}
	}

	std::size_t read_pointer = pulse_pointer_;
	pulse_pointer_++;
	return queued_pulses_[read_pointer];
}